

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O2

void duckdb::Binder::ReplaceStarExpression
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *expr,unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *replacement)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  bool bVar3;
  type pPVar4;
  pointer pPVar5;
  string alias;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(expr);
  bVar3 = StarExpression::IsColumns(pPVar4);
  if (!bVar3) {
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr);
    bVar3 = StarExpression::IsStar(pPVar4);
    if (!bVar3) {
      pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*(expr);
      local_30._8_8_ = 0;
      local_18 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:112:13)>
                 ::_M_invoke;
      local_20 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:112:13)>
                 ::_M_manager;
      local_30._M_unused._M_object = replacement;
      ParsedExpressionIterator::EnumerateChildren
                (pPVar4,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                         *)&local_30);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_30);
      return;
    }
  }
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  ::std::__cxx11::string::string
            ((string *)local_30._M_pod_data,(string *)&(pPVar5->super_BaseExpression).alias);
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(replacement);
  (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_38,pPVar5);
  _Var2._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl = (ParsedExpression *)0x0;
  _Var1._M_head_impl =
       (expr->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (expr->super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
  if ((_Var1._M_head_impl != (ParsedExpression *)0x0) &&
     ((**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))(),
     local_38._M_head_impl != (ParsedExpression *)0x0)) {
    (*((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_30._8_8_ != 0) {
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(expr);
    ::std::__cxx11::string::operator=
              ((string *)&(pPVar5->super_BaseExpression).alias,(string *)local_30._M_pod_data);
  }
  ::std::__cxx11::string::~string((string *)local_30._M_pod_data);
  return;
}

Assistant:

void Binder::ReplaceStarExpression(unique_ptr<ParsedExpression> &expr, unique_ptr<ParsedExpression> &replacement) {
	D_ASSERT(expr);
	if (StarExpression::IsColumns(*expr) || StarExpression::IsStar(*expr)) {
		D_ASSERT(replacement);
		auto alias = expr->GetAlias();
		expr = replacement->Copy();
		if (!alias.empty()) {
			expr->SetAlias(std::move(alias));
		}
		return;
	}
	ParsedExpressionIterator::EnumerateChildren(
	    *expr, [&](unique_ptr<ParsedExpression> &child_expr) { ReplaceStarExpression(child_expr, replacement); });
}